

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O1

uint32 lzham::lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)

{
  lzham_malloc_context context;
  uint32 uVar1;
  
  if (p == (lzham_decompress_state_ptr)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint32 *)((long)p + 0xf8);
    context = *p;
    lzham_free(context,*(void **)((long)p + 0xe8));
    lzham_decompressor::~lzham_decompressor((lzham_decompressor *)p);
    lzham_free(context,p);
    lzham_destroy_malloc_context(context);
  }
  return uVar1;
}

Assistant:

uint32 LZHAM_CDECL lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);
      if (!pState)
         return 0;

      uint32 adler32 = pState->m_decomp_adler32;

      lzham_malloc_context malloc_context = pState->m_malloc_context;

      lzham_free(malloc_context, pState->m_pRaw_decomp_buf);
      lzham_delete(malloc_context, pState);
      lzham_destroy_malloc_context(malloc_context);

      return adler32;
   }